

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

ssize_t __thiscall
zmq::detail::socket_base::send(socket_base *this,int __fd,void *__buf,size_t __n,int __flags)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  int nbytes;
  error_t *in_stack_ffffffffffffffd0;
  long local_8;
  
  pvVar1 = this->_handle;
  pcVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ee859);
  sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_register_00000034,__fd));
  iVar2 = zmq_send(pvVar1,pcVar3,sVar4,(ulong)__buf & 0xffffffff);
  if (iVar2 < 0) {
    iVar2 = zmq_errno();
    if (iVar2 != 0xb) {
      uVar5 = __cxa_allocate_exception(0x10);
      error_t::error_t(in_stack_ffffffffffffffd0);
      __cxa_throw(uVar5,&error_t::typeinfo,error_t::~error_t);
    }
    local_8 = 0;
  }
  else {
    local_8 = (long)iVar2;
  }
  return local_8;
}

Assistant:

inline size_t send(std::string const& msg, send_flags flags = send_flags::none)
		{
			int nbytes = zmq_send(_handle, (void *)msg.c_str(), msg.size(), static_cast<int>(flags));
			if (nbytes >= 0)
				return (size_t)nbytes;
			if (zmq_errno() == EAGAIN)
				return 0;
			throw error_t();
		}